

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void glcts::anon_unknown_0::ShaderSourceFactory::streamUniformDefinitions
               (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                *uniforms,GLenum shader,ostringstream *ret)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  string *psVar4;
  ostream *poVar5;
  ulong local_30;
  size_t child;
  size_t i;
  ostringstream *ret_local;
  GLenum shader_local;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *uniforms_local;
  
  for (child = 0;
      sVar2 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size(uniforms), child < sVar2; child = child + 1) {
    pvVar3 = std::
             vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             ::operator[](uniforms,child);
    bVar1 = DefOccurence::occurs(&pvVar3->declOccurence,shader);
    if (bVar1) {
      pvVar3 = std::
               vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ::operator[](uniforms,child);
      bVar1 = UniformType::isStruct(&pvVar3->type);
      if (bVar1) {
        poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"struct ")
        ;
        pvVar3 = std::
                 vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 ::operator[](uniforms,child);
        psVar4 = glcts::(anonymous_namespace)::UniformType::str_abi_cxx11_((UniformType *)pvVar3);
        poVar5 = std::operator<<(poVar5,(string *)psVar4);
        poVar5 = std::operator<<(poVar5," {");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_30 = 0;
        while( true ) {
          pvVar3 = std::
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   ::operator[](uniforms,child);
          sVar2 = std::
                  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                  ::size(&pvVar3->childUniforms);
          pvVar3 = std::
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   ::operator[](uniforms,child);
          if (sVar2 / (ulong)(long)(pvVar3->type).arraySize <= local_30) break;
          std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"    ");
          pvVar3 = std::
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   ::operator[](uniforms,child);
          pvVar3 = std::
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   ::operator[](&pvVar3->childUniforms,local_30);
          anon_unknown_0::Uniform::streamDefinition(pvVar3,ret);
          poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,";");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          local_30 = local_30 + 1;
        }
        poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"};");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      pvVar3 = std::
               vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ::operator[](uniforms,child);
      LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::streamDefinition
                (&pvVar3->location,ret,shader);
      std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"uniform ");
      pvVar3 = std::
               vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ::operator[](uniforms,child);
      anon_unknown_0::Uniform::streamDefinition(pvVar3,ret);
      poVar5 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,";");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

static void streamUniformDefinitions(const std::vector<Uniform>& uniforms, GLenum shader, std::ostringstream& ret)
	{
		for (size_t i = 0; i < uniforms.size(); i++)
		{
			if (uniforms[i].declOccurence.occurs(shader))
			{
				if (uniforms[i].type.isStruct())
				{
					ret << "struct " << uniforms[i].type.str() << " {" << std::endl;
					for (size_t child = 0; child < uniforms[i].childUniforms.size() / uniforms[i].type.arraySize;
						 child++)
					{
						ret << "    ";
						uniforms[i].childUniforms[child].streamDefinition(ret);
						ret << ";" << std::endl;
					}
					ret << "};" << std::endl;
				}
				uniforms[i].location.streamDefinition(ret, shader);
				ret << "uniform ";
				uniforms[i].streamDefinition(ret);
				ret << ";" << std::endl;
			}
		}
	}